

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Mf_Man_t * Mf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Mf_Man_t *pMVar2;
  abctime aVar3;
  Mf_Obj_t *pMVar4;
  Vec_Int_t *vRefs;
  Vec_Mem_t *local_38;
  int local_2c;
  int Entry;
  int i;
  Vec_Int_t *vFlowRefs;
  Mf_Man_t *p;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if ((pPars->nCutNum < 2) || (0x10 < pPars->nCutNum)) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= MF_CUT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x52e,"Mf_Man_t *Mf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if ((1 < pPars->nLutSize) && (pPars->nLutSize < 0xb)) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vMapping);
    iVar1 = Gia_ManHasChoices(pGia);
    if (iVar1 != 0) {
      Gia_ManSetPhase(pGia);
    }
    pMVar2 = (Mf_Man_t *)calloc(1,0xc0);
    aVar3 = Abc_Clock();
    pMVar2->clkStart = aVar3;
    pMVar2->pGia = pGia;
    pMVar2->pPars = pPars;
    if (pPars->fCutMin == 0) {
      local_38 = (Vec_Mem_t *)0x0;
    }
    else {
      local_38 = Vec_MemAllocForTT(pPars->nLutSize,0);
    }
    pMVar2->vTtMem = local_38;
    iVar1 = Gia_ManObjNum(pGia);
    pMVar4 = (Mf_Obj_t *)calloc((long)iVar1,0x10);
    pMVar2->pLfObjs = pMVar4;
    pMVar2->iCur = 2;
    Vec_PtrGrow(&pMVar2->vPages,0x100);
    if (pPars->fGenCnf != 0) {
      Vec_IntGrow(&pMVar2->vCnfSizes,10000);
      Vec_IntPush(&pMVar2->vCnfSizes,1);
      Vec_IntPush(&pMVar2->vCnfSizes,2);
      Vec_IntGrow(&pMVar2->vCnfMem,10000);
    }
    vRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs(pGia,vRefs);
    for (local_2c = 0; iVar1 = Vec_IntSize(vRefs), local_2c < iVar1; local_2c = local_2c + 1) {
      iVar1 = Vec_IntEntry(vRefs,local_2c);
      pMVar2->pLfObjs[local_2c].nFlowRefs = (float)iVar1;
    }
    Vec_IntFree(vRefs);
    return pMVar2;
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= MF_LEAF_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                ,0x52f,"Mf_Man_t *Mf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Mf_Man_t * Mf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Vec_Int_t * vFlowRefs;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= MF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= MF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Mf_Man_t, 1 );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    p->pLfObjs   = ABC_CALLOC( Mf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur      = 2;
    Vec_PtrGrow( &p->vPages, 256 );
    if ( pPars->fGenCnf )
    {
        Vec_IntGrow( &p->vCnfSizes, 10000 );
        Vec_IntPush( &p->vCnfSizes, 1 );
        Vec_IntPush( &p->vCnfSizes, 2 );
        Vec_IntGrow( &p->vCnfMem, 10000 );
    }
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
        p->pLfObjs[i].nFlowRefs = Entry;
    Vec_IntFree(vFlowRefs);
    return p;
}